

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPool.hpp
# Opt level: O0

Char * __thiscall Diligent::StringPool::Allocate(StringPool *this,size_t Length)

{
  Char *pCVar1;
  Char *Ptr;
  undefined1 local_38 [8];
  string msg;
  size_t Length_local;
  StringPool *this_local;
  
  msg.field_2._8_8_ = Length;
  if (this->m_pBuffer + this->m_ReservedSize < this->m_pCurrPtr + Length) {
    FormatString<char[31]>((string *)local_38,(char (*) [31])"Not enough space in the buffer");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringPool.hpp"
               ,0x76);
    std::__cxx11::string::~string((string *)local_38);
  }
  pCVar1 = this->m_pCurrPtr;
  this->m_pCurrPtr = this->m_pCurrPtr + msg.field_2._8_8_;
  return pCVar1;
}

Assistant:

Char* Allocate(size_t Length)
    {
        VERIFY(m_pCurrPtr + Length <= m_pBuffer + m_ReservedSize, "Not enough space in the buffer");
        auto* Ptr = m_pCurrPtr;
        m_pCurrPtr += Length;
        return Ptr;
    }